

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O0

void expand_sha1(uint8_t *okm,uint8_t *prk,uint32_t prklen,uint8_t *info,uint32_t infolen,
                uint32_t len)

{
  long lVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint32_t uVar9;
  int iVar10;
  undefined8 uStack_90;
  uint8_t auStack_88 [8];
  uint8_t *local_80;
  uint8_t *local_78;
  uint8_t *block;
  uint8_t *puStack_68;
  uint32_t i;
  uint8_t *ctr;
  uint8_t *tag;
  uint8_t *text0;
  unsigned_long __vla_expr0;
  uint8_t *local_40;
  uint8_t *output;
  uint32_t n;
  uint32_t tlen;
  uint32_t len_local;
  uint32_t infolen_local;
  uint8_t *info_local;
  uint8_t *puStack_18;
  uint32_t prklen_local;
  uint8_t *prk_local;
  uint8_t *okm_local;
  
  __vla_expr0 = (unsigned_long)auStack_88;
  output._4_4_ = 0x14;
  output._0_4_ = len / 0x14;
  text0 = (uint8_t *)(ulong)(infolen + 0x15);
  lVar1 = -((ulong)(text0 + 0xf) & 0xfffffffffffffff0);
  local_80 = auStack_88 + lVar1;
  local_40 = okm;
  n = len;
  tlen = infolen;
  _len_local = info;
  info_local._4_4_ = prklen;
  puStack_18 = prk;
  prk_local = okm;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x29974c;
  memset(auStack_88 + lVar1,0,(ulong)(infolen + 0x15));
  puVar2 = _len_local;
  tag = local_80 + output._4_4_;
  ctr = local_80;
  puStack_68 = local_80 + (ulong)tlen + (ulong)output._4_4_;
  puVar8 = local_80 + output._4_4_;
  uVar7 = (ulong)tlen;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x299790;
  memcpy(puVar8,puVar2,uVar7);
  for (block._4_4_ = 0; block._4_4_ < (uint)output; block._4_4_ = block._4_4_ + 1) {
    *puStack_68 = (char)block._4_4_ + '\x01';
    puVar5 = puStack_18;
    uVar4 = info_local._4_4_;
    puVar3 = tag;
    puVar8 = ctr;
    puVar2 = local_80;
    if (block._4_4_ == 0) {
      uVar9 = tlen + 1;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x2997d3;
      EverCrypt_HMAC_compute_sha1(puVar8,puVar5,uVar4,puVar3,uVar9);
    }
    else {
      iVar10 = output._4_4_ + tlen;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x2997f5;
      EverCrypt_HMAC_compute_sha1(puVar8,puVar5,uVar4,puVar2,iVar10 + 1);
    }
    puVar2 = ctr;
    puVar8 = local_40 + block._4_4_ * output._4_4_;
    uVar7 = (ulong)output._4_4_;
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x299817;
    memcpy(puVar8,puVar2,uVar7);
  }
  if ((uint)output * output._4_4_ < n) {
    *puStack_68 = (char)(uint)output + '\x01';
    puVar5 = puStack_18;
    uVar4 = info_local._4_4_;
    puVar3 = tag;
    puVar8 = ctr;
    puVar2 = local_80;
    if ((uint)output == 0) {
      uVar9 = tlen + 1;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x299865;
      EverCrypt_HMAC_compute_sha1(puVar8,puVar5,uVar4,puVar3,uVar9);
    }
    else {
      iVar10 = output._4_4_ + tlen;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x299887;
      EverCrypt_HMAC_compute_sha1(puVar8,puVar5,uVar4,puVar2,iVar10 + 1);
    }
    puVar2 = ctr;
    puVar8 = prk_local + (uint)output * output._4_4_;
    uVar6 = n - (uint)output * output._4_4_;
    local_78 = puVar8;
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x2998bc;
    memcpy(puVar8,puVar2,(ulong)uVar6);
  }
  return;
}

Assistant:

static void
expand_sha1(
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  uint32_t tlen = 20U;
  uint32_t n = len / tlen;
  uint8_t *output = okm;
  KRML_CHECK_SIZE(sizeof (uint8_t), tlen + infolen + 1U);
  uint8_t text[tlen + infolen + 1U];
  memset(text, 0U, (tlen + infolen + 1U) * sizeof (uint8_t));
  uint8_t *text0 = text + tlen;
  uint8_t *tag = text;
  uint8_t *ctr = text + tlen + infolen;
  memcpy(text + tlen, info, infolen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < n; i++)
  {
    ctr[0U] = (uint8_t)(i + 1U);
    if (i == 0U)
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    memcpy(output + i * tlen, tag, tlen * sizeof (uint8_t));
  }
  if (n * tlen < len)
  {
    ctr[0U] = (uint8_t)(n + 1U);
    if (n == 0U)
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    uint8_t *block = okm + n * tlen;
    memcpy(block, tag, (len - n * tlen) * sizeof (uint8_t));
  }
}